

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_chacha20poly1305.cc
# Opt level: O0

void calc_tag(uint8_t *tag,uint8_t *key,uint8_t *nonce,uint8_t *ad,size_t ad_len,uint8_t *ciphertext
             ,size_t ciphertext_len,uint8_t *ciphertext_extra,size_t ciphertext_extra_len)

{
  ulong data_len;
  size_t ciphertext_total;
  poly1305_state ctx;
  uint8_t poly1305_key [32];
  uint8_t *ciphertext_local;
  size_t ad_len_local;
  uint8_t *ad_local;
  uint8_t *nonce_local;
  uint8_t *key_local;
  uint8_t *tag_local;
  
  OPENSSL_memset(ctx + 0x1f8,0,0x20);
  CRYPTO_chacha_20(ctx + 0x1f8,ctx + 0x1f8,0x20,key,nonce,0);
  CRYPTO_poly1305_init((poly1305_state *)&ciphertext_total,ctx + 0x1f8);
  CRYPTO_poly1305_update((poly1305_state *)&ciphertext_total,ad,ad_len);
  if ((ad_len & 0xf) != 0) {
    CRYPTO_poly1305_update((poly1305_state *)&ciphertext_total,"",0x10 - (ad_len & 0xf));
  }
  CRYPTO_poly1305_update((poly1305_state *)&ciphertext_total,ciphertext,ciphertext_len);
  CRYPTO_poly1305_update((poly1305_state *)&ciphertext_total,ciphertext_extra,ciphertext_extra_len);
  data_len = ciphertext_len + ciphertext_extra_len;
  if ((data_len & 0xf) != 0) {
    CRYPTO_poly1305_update((poly1305_state *)&ciphertext_total,"",0x10 - (data_len & 0xf));
  }
  poly1305_update_length((poly1305_state *)&ciphertext_total,ad_len);
  poly1305_update_length((poly1305_state *)&ciphertext_total,data_len);
  CRYPTO_poly1305_finish((poly1305_state *)&ciphertext_total,tag);
  return;
}

Assistant:

static void calc_tag(uint8_t tag[POLY1305_TAG_LEN], const uint8_t *key,
                     const uint8_t nonce[12], const uint8_t *ad, size_t ad_len,
                     const uint8_t *ciphertext, size_t ciphertext_len,
                     const uint8_t *ciphertext_extra,
                     size_t ciphertext_extra_len) {
  alignas(16) uint8_t poly1305_key[32];
  OPENSSL_memset(poly1305_key, 0, sizeof(poly1305_key));
  CRYPTO_chacha_20(poly1305_key, poly1305_key, sizeof(poly1305_key), key, nonce,
                   0);

  static const uint8_t padding[16] = { 0 };  // Padding is all zeros.
  poly1305_state ctx;
  CRYPTO_poly1305_init(&ctx, poly1305_key);
  CRYPTO_poly1305_update(&ctx, ad, ad_len);
  if (ad_len % 16 != 0) {
    CRYPTO_poly1305_update(&ctx, padding, sizeof(padding) - (ad_len % 16));
  }
  CRYPTO_poly1305_update(&ctx, ciphertext, ciphertext_len);
  CRYPTO_poly1305_update(&ctx, ciphertext_extra, ciphertext_extra_len);
  const size_t ciphertext_total = ciphertext_len + ciphertext_extra_len;
  if (ciphertext_total % 16 != 0) {
    CRYPTO_poly1305_update(&ctx, padding,
                           sizeof(padding) - (ciphertext_total % 16));
  }
  poly1305_update_length(&ctx, ad_len);
  poly1305_update_length(&ctx, ciphertext_total);
  CRYPTO_poly1305_finish(&ctx, tag);
}